

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O2

void __thiscall HEkkDual::iterationAnalysisMajor(HEkkDual *this)

{
  bool bVar1;
  
  iterationAnalysisMajorData(this);
  if (this->edge_weight_mode == kSteepestEdge) {
    bVar1 = HEkk::switchToDevex(this->ekk_instance_);
    if (bVar1) {
      this->edge_weight_mode = kDevex;
      initialiseDevexFramework(this);
    }
  }
  if (this->analysis->analyse_simplex_summary_data == true) {
    HighsSimplexAnalysis::iterationRecord(this->analysis);
    HighsSimplexAnalysis::iterationRecordMajor(this->analysis);
    return;
  }
  return;
}

Assistant:

void HEkkDual::iterationAnalysisMajor() {
  iterationAnalysisMajorData();
  // Possibly switch from DSE to Devex
  if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
    bool switch_to_devex = false;
    //    switch_to_devex = analysis->switchToDevex();
    switch_to_devex = ekk_instance_.switchToDevex();
    if (switch_to_devex) {
      edge_weight_mode = EdgeWeightMode::kDevex;
      // Set up the Devex framework
      initialiseDevexFramework();
    }
  }
  if (analysis->analyse_simplex_summary_data) {
    analysis->iterationRecord();
    analysis->iterationRecordMajor();
  }
}